

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t sysbvm_parser_parsePragmaList(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  int iVar1;
  sysbvm_tuple_t orderedCollection;
  sysbvm_tuple_t element;
  sysbvm_tuple_t pragma;
  sysbvm_tuple_t list;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 0xf) {
    orderedCollection = sysbvm_orderedCollection_create(context);
    while( true ) {
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 != 0xf) break;
      element = sysbvm_parser_parsePragma(context,state);
      sysbvm_orderedCollection_add(context,orderedCollection,element);
    }
    context_local = (sysbvm_context_t *)sysbvm_orderedCollection_asArray(context,orderedCollection);
  }
  else {
    context_local = (sysbvm_context_t *)sysbvm_array_create(context,0);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parsePragmaList(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_LESS_THAN)
        return sysbvm_array_create(context, 0);

    sysbvm_tuple_t list = sysbvm_orderedCollection_create(context);
    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_LESS_THAN)
    {
        sysbvm_tuple_t pragma = sysbvm_parser_parsePragma(context, state);
        sysbvm_orderedCollection_add(context, list, pragma);
    }

    return sysbvm_orderedCollection_asArray(context, list);
}